

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_perl_generator.cc
# Opt level: O1

void __thiscall
t_perl_generator::generate_service_helpers(t_perl_generator *this,t_service *tservice)

{
  ofstream_with_content_based_conditional_update *out;
  t_struct *tstruct;
  long lVar1;
  pointer pcVar2;
  int iVar3;
  ostream *poVar4;
  undefined4 extraout_var;
  long *plVar5;
  long *plVar6;
  pointer pptVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string name;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  long *local_68;
  long local_60;
  long local_58;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  vector<t_function_*,_std::allocator<t_function_*>_> local_48;
  
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector(&local_48,&tservice->functions_);
  out = &this->f_service_;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)out,"# HELPER FUNCTIONS AND STRUCTURES",0x21);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)out,::endl_abi_cxx11_._M_dataplus._M_p,
                      ::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (local_48.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_48.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pptVar7 = local_48.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      tstruct = (*pptVar7)->arglist_;
      iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
      local_88[0] = local_78;
      lVar1 = *(long *)CONCAT44(extraout_var,iVar3);
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_88,lVar1,((long *)CONCAT44(extraout_var,iVar3))[1] + lVar1);
      local_a8[0] = local_98;
      pcVar2 = (this->super_t_oop_generator).super_t_generator.service_name_._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_a8,pcVar2,
                 pcVar2 + (this->super_t_oop_generator).super_t_generator.service_name_.
                          _M_string_length);
      std::__cxx11::string::append((char *)local_a8);
      plVar5 = (long *)std::__cxx11::string::_M_append((char *)local_a8,(ulong)local_88[0]);
      plVar6 = plVar5 + 2;
      if ((long *)*plVar5 == plVar6) {
        local_58 = *plVar6;
        uStack_50 = (undefined4)plVar5[3];
        uStack_4c = *(undefined4 *)((long)plVar5 + 0x1c);
        local_68 = &local_58;
      }
      else {
        local_58 = *plVar6;
        local_68 = (long *)*plVar5;
      }
      local_60 = plVar5[1];
      *plVar5 = (long)plVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[2])(tstruct,&local_68);
      if (local_68 != &local_58) {
        operator_delete(local_68);
      }
      if (local_a8[0] != local_98) {
        operator_delete(local_a8[0]);
      }
      generate_perl_struct_definition(this,(ostream *)out,tstruct,false);
      generate_perl_function_helpers(this,*pptVar7);
      (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[2])(tstruct,(string *)local_88);
      if (local_88[0] != local_78) {
        operator_delete(local_88[0]);
      }
      pptVar7 = pptVar7 + 1;
    } while (pptVar7 !=
             local_48.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if (local_48.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void t_perl_generator::generate_service_helpers(t_service* tservice) {
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::iterator f_iter;

  f_service_ << "# HELPER FUNCTIONS AND STRUCTURES" << endl << endl;

  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    t_struct* ts = (*f_iter)->get_arglist();
    string name = ts->get_name();
    ts->set_name(service_name_ + "_" + name);
    generate_perl_struct_definition(f_service_, ts, false);
    generate_perl_function_helpers(*f_iter);
    ts->set_name(name);
  }
}